

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void EMIT_OP_REG_REG(CodeGenGenericContext *ctx,x86Command op,x86Reg reg1,x86Reg reg2)

{
  x86Argument arg;
  CodeGenGenericContext *this;
  x86Reg xVar1;
  x86Argument local_40;
  x86Reg local_20;
  x86Reg local_1c;
  x86Reg redirect;
  x86Reg reg2_local;
  x86Reg reg1_local;
  x86Command op_local;
  CodeGenGenericContext *ctx_local;
  
  local_1c = reg2;
  redirect = reg1;
  reg2_local = op;
  _reg1_local = ctx;
  switch(op) {
  case o_mov:
  case o_mov64:
    if ((ctx->skipTracking & 1U) == 0) {
      local_1c = CodeGenGenericContext::RedirectRegister(ctx,reg2);
      if (redirect == local_1c) {
        _reg1_local->optimizationCount = _reg1_local->optimizationCount + 1;
        return;
      }
      CodeGenGenericContext::ReadRegister(_reg1_local,local_1c);
      this = _reg1_local;
      xVar1 = redirect;
      x86Argument::x86Argument(&local_40,local_1c);
      arg.field_1.reg = local_40.field_1.reg;
      arg.type = local_40.type;
      arg._4_4_ = local_40._4_4_;
      arg.field_1.imm64Arg._4_4_ = (int)((ulong)local_40.field_1 >> 0x20);
      arg.ptrBase = local_40.ptrBase;
      arg.ptrIndex = local_40.ptrIndex;
      arg.ptrMult = local_40.ptrMult;
      arg.ptrNum = local_40.ptrNum;
      CodeGenGenericContext::OverwriteRegisterWithValue(this,xVar1,arg);
    }
    break;
  default:
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x54d,"void EMIT_OP_REG_REG(CodeGenGenericContext &, x86Command, x86Reg, x86Reg)"
                 );
  case o_add:
  case o_sub:
    local_1c = CodeGenGenericContext::RedirectRegister(ctx,reg2);
    if (_reg1_local->genReg[local_1c].type == argNumber) {
      EMIT_OP_REG_NUM(_reg1_local,reg2_local,redirect,_reg1_local->genReg[local_1c].field_1.labelID)
      ;
      return;
    }
    CodeGenGenericContext::ReadRegister(_reg1_local,local_1c);
    CodeGenGenericContext::ReadAndModifyRegister(_reg1_local,redirect);
    break;
  case o_adc:
  case o_sbb:
    local_1c = CodeGenGenericContext::RedirectRegister(ctx,reg2);
    CodeGenGenericContext::ReadRegister(_reg1_local,local_1c);
    CodeGenGenericContext::ReadAndModifyRegister(_reg1_local,redirect);
    break;
  case o_imul:
    if ((ctx->genReg[reg2].type == argPtr) && (ctx->genReg[reg2].field_1.reg == rECX)) {
      EMIT_OP_REG_RPTR(ctx,op,reg1,ctx->genReg[reg2].field_1.ptrSize,ctx->genReg[reg2].ptrIndex,
                       ctx->genReg[reg2].ptrMult,ctx->genReg[reg2].ptrBase,ctx->genReg[reg2].ptrNum)
      ;
      return;
    }
    CodeGenGenericContext::ReadRegister(ctx,reg2);
    CodeGenGenericContext::ReadAndModifyRegister(_reg1_local,redirect);
    break;
  case o_sal:
  case o_sar:
  case o_sal64:
  case o_sar64:
    if ((ctx->genReg[reg2].type == argNumber) &&
       ((int)(char)ctx->genReg[reg2].field_1.num == ctx->genReg[reg2].field_1.reg)) {
      EMIT_OP_REG_NUM(ctx,op,reg1,ctx->genReg[reg2].field_1.labelID);
      return;
    }
    local_20 = CodeGenGenericContext::RedirectRegister(ctx,reg2);
    if ((_reg1_local->genReg[local_20].type == argNumber) &&
       ((int)(char)_reg1_local->genReg[local_20].field_1.num ==
        _reg1_local->genReg[local_20].field_1.reg)) {
      EMIT_OP_REG_NUM(_reg1_local,reg2_local,redirect,_reg1_local->genReg[local_20].field_1.labelID)
      ;
      return;
    }
    CodeGenGenericContext::ReadRegister(_reg1_local,local_1c);
    CodeGenGenericContext::ReadAndModifyRegister(_reg1_local,redirect);
    break;
  case o_and:
  case o_or:
    local_1c = CodeGenGenericContext::RedirectRegister(ctx,reg2);
    CodeGenGenericContext::ReadRegister(_reg1_local,local_1c);
    CodeGenGenericContext::ReadAndModifyRegister(_reg1_local,redirect);
    break;
  case o_xor:
  case o_xor64:
    if (reg1 == reg2) {
      CodeGenGenericContext::KillRegister(ctx,reg1);
      CodeGenGenericContext::InvalidateDependand(_reg1_local,redirect);
    }
    else {
      local_1c = CodeGenGenericContext::RedirectRegister(ctx,reg2);
      CodeGenGenericContext::ReadRegister(_reg1_local,local_1c);
      CodeGenGenericContext::ReadAndModifyRegister(_reg1_local,redirect);
    }
    break;
  case o_cmp:
  case o_cmp64:
    redirect = CodeGenGenericContext::RedirectRegister(ctx,reg1);
    local_1c = CodeGenGenericContext::RedirectRegister(_reg1_local,local_1c);
    if (_reg1_local->genReg[local_1c].type == argNumber) {
      EMIT_OP_REG_NUM(_reg1_local,reg2_local,redirect,_reg1_local->genReg[local_1c].field_1.labelID)
      ;
      return;
    }
    if (_reg1_local->genReg[local_1c].type == argPtr) {
      xVar1 = rEDX;
      if (reg2_local == 0x2a) {
        xVar1 = rECX;
      }
      if (_reg1_local->genReg[local_1c].field_1.reg == xVar1) {
        EMIT_OP_REG_RPTR(_reg1_local,reg2_local,redirect,
                         _reg1_local->genReg[local_1c].field_1.ptrSize,
                         _reg1_local->genReg[local_1c].ptrIndex,
                         _reg1_local->genReg[local_1c].ptrMult,_reg1_local->genReg[local_1c].ptrBase
                         ,_reg1_local->genReg[local_1c].ptrNum);
        return;
      }
    }
    CodeGenGenericContext::ReadRegister(_reg1_local,redirect);
    CodeGenGenericContext::ReadRegister(_reg1_local,local_1c);
    break;
  case o_test:
    redirect = CodeGenGenericContext::RedirectRegister(ctx,reg1);
    local_1c = CodeGenGenericContext::RedirectRegister(_reg1_local,local_1c);
    CodeGenGenericContext::ReadRegister(_reg1_local,redirect);
    CodeGenGenericContext::ReadRegister(_reg1_local,local_1c);
    break;
  case o_add64:
  case o_sub64:
    local_1c = CodeGenGenericContext::RedirectRegister(ctx,reg2);
    CodeGenGenericContext::ReadRegister(_reg1_local,local_1c);
    CodeGenGenericContext::ReadAndModifyRegister(_reg1_local,redirect);
    break;
  case o_imul64:
    if ((ctx->genReg[reg2].type == argPtr) && (ctx->genReg[reg2].field_1.reg == rEDX)) {
      EMIT_OP_REG_RPTR(ctx,op,reg1,ctx->genReg[reg2].field_1.ptrSize,ctx->genReg[reg2].ptrIndex,
                       ctx->genReg[reg2].ptrMult,ctx->genReg[reg2].ptrBase,ctx->genReg[reg2].ptrNum)
      ;
      return;
    }
    CodeGenGenericContext::ReadRegister(ctx,reg2);
    CodeGenGenericContext::ReadAndModifyRegister(_reg1_local,redirect);
    break;
  case o_and64:
  case o_or64:
    local_1c = CodeGenGenericContext::RedirectRegister(ctx,reg2);
    CodeGenGenericContext::ReadRegister(_reg1_local,local_1c);
    CodeGenGenericContext::ReadAndModifyRegister(_reg1_local,redirect);
  }
  _reg1_local->x86Op->name = reg2_local;
  (_reg1_local->x86Op->argA).type = argReg;
  (_reg1_local->x86Op->argA).field_1.reg = redirect;
  (_reg1_local->x86Op->argB).type = argReg;
  (_reg1_local->x86Op->argB).field_1.reg = local_1c;
  _reg1_local->x86Op = _reg1_local->x86Op + 1;
  return;
}

Assistant:

void EMIT_OP_REG_REG(CodeGenGenericContext &ctx, x86Command op, x86Reg reg1, x86Reg reg2)
{
#ifdef NULLC_OPTIMIZE_X86
	switch(op)
	{
	case o_xor:
	case o_xor64:
		if(reg1 == reg2)
		{
			ctx.KillRegister(reg1);
			ctx.InvalidateDependand(reg1);
		}
		else
		{
			reg2 = ctx.RedirectRegister(reg2);

			ctx.ReadRegister(reg2);
			ctx.ReadAndModifyRegister(reg1);
		}
		break;
	case o_cmp:
	case o_cmp64:
		reg1 = ctx.RedirectRegister(reg1);
		reg2 = ctx.RedirectRegister(reg2);

		// Load source directly from memory
		if(ctx.genReg[reg2].type == x86Argument::argNumber)
		{
			EMIT_OP_REG_NUM(ctx, op, reg1, ctx.genReg[reg2].num);
			return;
		}

		// Load source directly from memory
		if(ctx.genReg[reg2].type == x86Argument::argPtr && ctx.genReg[reg2].ptrSize == (op == o_cmp ? sDWORD : sQWORD))
		{
			EMIT_OP_REG_RPTR(ctx, op, reg1, ctx.genReg[reg2].ptrSize, ctx.genReg[reg2].ptrIndex, ctx.genReg[reg2].ptrMult, ctx.genReg[reg2].ptrBase, ctx.genReg[reg2].ptrNum);
			return;
		}

		ctx.ReadRegister(reg1);
		ctx.ReadRegister(reg2);
		break;
	case o_test:
		reg1 = ctx.RedirectRegister(reg1);
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg1);
		ctx.ReadRegister(reg2);
		break;
	case o_add:
	case o_sub:
		reg2 = ctx.RedirectRegister(reg2);

		if(ctx.genReg[reg2].type == x86Argument::argNumber)
		{
			EMIT_OP_REG_NUM(ctx, op, reg1, ctx.genReg[reg2].num);
			return;
		}

		// TODO: if there is a known number in destination, we can perform a lea

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_adc:
	case o_sbb:
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_add64:
	case o_sub64:
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_sal:
	case o_sar:
	case o_sal64:
	case o_sar64:
		// Can't redirect source register since the instruction has it fixed to ecx

		if(ctx.genReg[reg2].type == x86Argument::argNumber && (char)ctx.genReg[reg2].num == ctx.genReg[reg2].num)
		{
			EMIT_OP_REG_NUM(ctx, op, reg1, ctx.genReg[reg2].num);
			return;
		}

		{
			x86Reg redirect = ctx.RedirectRegister(reg2);

			if(ctx.genReg[redirect].type == x86Argument::argNumber && (char)ctx.genReg[redirect].num == ctx.genReg[redirect].num)
			{
				EMIT_OP_REG_NUM(ctx, op, reg1, ctx.genReg[redirect].num);
				return;
			}
		}

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_and:
	case o_or:
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_and64:
	case o_or64:
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_imul:
		// Load source directly from memory
		if(ctx.genReg[reg2].type == x86Argument::argPtr && ctx.genReg[reg2].ptrSize == sDWORD)
		{
			EMIT_OP_REG_RPTR(ctx, op, reg1, ctx.genReg[reg2].ptrSize, ctx.genReg[reg2].ptrIndex, ctx.genReg[reg2].ptrMult, ctx.genReg[reg2].ptrBase, ctx.genReg[reg2].ptrNum);
			return;
		}

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_imul64:
		// Load source directly from memory
		if(ctx.genReg[reg2].type == x86Argument::argPtr && ctx.genReg[reg2].ptrSize == sQWORD)
		{
			EMIT_OP_REG_RPTR(ctx, op, reg1, ctx.genReg[reg2].ptrSize, ctx.genReg[reg2].ptrIndex, ctx.genReg[reg2].ptrMult, ctx.genReg[reg2].ptrBase, ctx.genReg[reg2].ptrNum);
			return;
		}

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_mov:
	case o_mov64:
		if(ctx.skipTracking)
			break;

		reg2 = ctx.RedirectRegister(reg2);

		// Skip self-assignment
		if(reg1 == reg2)
		{
			ctx.optimizationCount++;
			return;
		}

		ctx.ReadRegister(reg2);

		ctx.OverwriteRegisterWithValue(reg1, x86Argument(reg2));
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argReg;
	ctx.x86Op->argA.reg = reg1;
	ctx.x86Op->argB.type = x86Argument::argReg;
	ctx.x86Op->argB.reg = reg2;
	ctx.x86Op++;
}